

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void addDataToBuffer(OutputBuffer *buf,size_t size)

{
  string data;
  string local_30;
  
  makeString_abi_cxx11_(&local_30,size);
  avro::OutputBuffer::writeTo(buf,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void addDataToBuffer(OutputBuffer &buf, size_t size)
{
    std::string data = makeString(size);
    buf.writeTo(data.c_str(), data.size());
}